

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_par_addsub_ge(DisasContext_conflict1 *s,arg_rrr *a,
                      _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_ptr_conflict *gen)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  ulong uVar2;
  TCGTemp *pTVar3;
  uintptr_t o;
  TCGv_i32 var;
  TCGv_i32 var_00;
  TCGContext_conflict1 *tcg_ctx;
  
  s_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    uVar2 = s->features & 8;
  }
  else {
    uVar2 = s->features >> 0x22 & 1;
  }
  if (uVar2 != 0) {
    iVar1 = a->rn;
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var_00 = (TCGv_i32)((long)pTVar3 - (long)s_00);
    load_reg_var(s,var_00,iVar1);
    iVar1 = a->rm;
    s_01 = s->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar3 - (long)s_01);
    load_reg_var(s,var,iVar1);
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_aarch64
              (s_00,(TCGv_i64)((long)pTVar3 - (long)s_00),(TCGv_i64)s_00->cpu_env,0x21c);
    (*gen)(s_00,var_00,var_00,var,(TCGv_ptr)((long)pTVar3 - (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,pTVar3);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
    store_reg(s,a->rd,var_00);
  }
  return uVar2 != 0;
}

Assistant:

static bool op_par_addsub_ge(DisasContext *s, arg_rrr *a,
                             void (*gen)(TCGContext *, TCGv_i32, TCGv_i32,
                                         TCGv_i32, TCGv_ptr))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1;
    TCGv_ptr ge;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t0 = load_reg(s, a->rn);
    t1 = load_reg(s, a->rm);

    ge = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, ge, tcg_ctx->cpu_env, offsetof(CPUARMState, GE));
    gen(tcg_ctx, t0, t0, t1, ge);

    tcg_temp_free_ptr(tcg_ctx, ge);
    tcg_temp_free_i32(tcg_ctx, t1);
    store_reg(s, a->rd, t0);
    return true;
}